

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

bool __thiscall
gl4cts::GPUShaderFP64Test5::executeIteration(GPUShaderFP64Test5 *this,_test_case *test_case)

{
  GLint GVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  deUint32 dVar6;
  GLenum GVar7;
  uchar *puVar8;
  TestError *this_00;
  RenderContext *pRVar9;
  undefined4 extraout_var;
  void *xfb_data_ptr;
  Functions *gl;
  uint local_34;
  double *pdStack_30;
  uint n_base_value;
  uchar *base_value_traveller_ptr;
  uint n_base_values;
  uint base_value_component_size;
  _variable_type base_value_type;
  bool result;
  _test_case *test_case_local;
  GPUShaderFP64Test5 *this_local;
  long lVar10;
  
  n_base_values = Utils::getBaseVariableType(test_case->src_type);
  if (n_base_values == VARIABLE_TYPE_BOOL) {
    n_base_values = 0x12;
  }
  uVar4 = Utils::getBaseVariableTypeComponentSize(n_base_values);
  puVar8 = (uchar *)operator_new__((ulong)(uVar4 * 5));
  this->m_base_value_bo_data = puVar8;
  pdStack_30 = (double *)this->m_base_value_bo_data;
  for (local_34 = 0; local_34 < 5; local_34 = local_34 + 1) {
    switch(n_base_values) {
    case 4:
      *pdStack_30 = (double)this->m_base_values[local_34];
      break;
    default:
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unrecognized base value type",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                 ,0x1cb8);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    case 0x11:
      *(float *)pdStack_30 = this->m_base_values[local_34];
      break;
    case 0x12:
      *(int *)pdStack_30 = (int)this->m_base_values[local_34];
      break;
    case 0x1f:
      *(float *)pdStack_30 = (float)(long)this->m_base_values[local_34];
    }
    pdStack_30 = (double *)((long)pdStack_30 + (ulong)uVar4);
  }
  pRVar9 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar5 = (*pRVar9->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar5);
  (**(code **)(lVar10 + 0x40))(0x8892,this->m_base_value_bo_id);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"glBindBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x1cc3);
  (**(code **)(lVar10 + 0x168))(0x8892,0,uVar4 * 5,this->m_base_value_bo_data);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"glBufferSubData() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x1cc6);
  if (n_base_values == 0x11) {
    pcVar2 = *(code **)(lVar10 + 0x19f0);
    GVar1 = this->m_po_base_value_attribute_location;
    GVar7 = Utils::getGLDataTypeOfBaseVariableType(VARIABLE_TYPE_FLOAT);
    (*pcVar2)(GVar1,1,GVar7,0,0,0);
    dVar6 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar6,"glVertexAttribPointer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x1cd1);
  }
  else if ((n_base_values == 0x12) || (n_base_values == 0x1f)) {
    pcVar2 = *(code **)(lVar10 + 0x1958);
    GVar1 = this->m_po_base_value_attribute_location;
    GVar7 = Utils::getGLDataTypeOfBaseVariableType(n_base_values);
    (*pcVar2)(GVar1,1,GVar7,0,0);
    dVar6 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar6,"glVertexAttribIPointer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x1cd8);
  }
  else {
    (**(code **)(lVar10 + 0x19a8))(this->m_po_base_value_attribute_location,1,0x140a,0,0);
    dVar6 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar6,"glVertxAttribLPointer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x1ce1);
  }
  (**(code **)(lVar10 + 0x610))(this->m_po_base_value_attribute_location);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"glEnableVertexAttribArray() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x1ce5);
  (**(code **)(lVar10 + 0x1680))(this->m_po_id);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"glUseProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x1ce9);
  (**(code **)(lVar10 + 0x30))(0);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"glBeginTransformFeedback() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x1cec);
  (**(code **)(lVar10 + 0x538))(0,0,5);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"glDrawArrays() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x1cef);
  (**(code **)(lVar10 + 0x638))();
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"glEndTransformFeedback() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x1cf2);
  puVar8 = (uchar *)(**(code **)(lVar10 + 0xcf8))(0x8c8e,35000);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"glMapBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x1cf7);
  bVar3 = verifyXFBData(this,puVar8,test_case);
  (**(code **)(lVar10 + 0x1670))(0x8c8e);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"glUnmapBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x1cff);
  if (this->m_base_value_bo_data != (uchar *)0x0) {
    if (this->m_base_value_bo_data != (uchar *)0x0) {
      operator_delete__(this->m_base_value_bo_data);
    }
    this->m_base_value_bo_data = (uchar *)0x0;
  }
  return bVar3;
}

Assistant:

bool GPUShaderFP64Test5::executeIteration(const _test_case& test_case)
{
	bool result = true;

	/* Convert the base values array to the type of input attribute we'll be using
	 * for the iteration.
	 */
	Utils::_variable_type base_value_type = Utils::getBaseVariableType(test_case.src_type);

	if (base_value_type == Utils::VARIABLE_TYPE_BOOL)
	{
		/* bools are actually represented by ints, since bool varyings are not allowed */
		base_value_type = Utils::VARIABLE_TYPE_INT;
	}

	const unsigned int base_value_component_size = Utils::getBaseVariableTypeComponentSize(base_value_type);
	const unsigned int n_base_values			 = sizeof(m_base_values) / sizeof(m_base_values[0]);

	m_base_value_bo_data = new unsigned char[base_value_component_size * n_base_values];

	unsigned char* base_value_traveller_ptr = m_base_value_bo_data;

	for (unsigned int n_base_value = 0; n_base_value < n_base_values; ++n_base_value)
	{
		switch (base_value_type)
		{
		case Utils::VARIABLE_TYPE_DOUBLE:
			*((double*)base_value_traveller_ptr) = (double)m_base_values[n_base_value];
			break;
		case Utils::VARIABLE_TYPE_FLOAT:
			*((float*)base_value_traveller_ptr) = (float)m_base_values[n_base_value];
			break;
		case Utils::VARIABLE_TYPE_INT:
			*((int*)base_value_traveller_ptr) = (int)m_base_values[n_base_value];
			break;
		case Utils::VARIABLE_TYPE_UINT:
			*((unsigned int*)base_value_traveller_ptr) = (unsigned int)m_base_values[n_base_value];
			break;

		default:
		{
			TCU_FAIL("Unrecognized base value type");
		}
		}

		base_value_traveller_ptr += base_value_component_size;
	} /* for (all base values) */

	/* Update buffer object storage with the data we've just finished preparing. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.bindBuffer(GL_ARRAY_BUFFER, m_base_value_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed.");

	gl.bufferSubData(GL_ARRAY_BUFFER, 0 /* offset */, base_value_component_size * n_base_values, m_base_value_bo_data);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferSubData() call failed.");

	/* Configure vertex attribute array corresponding to 'base_value' attribute, so that the
	 * new data is interpreted correctly.
	 */
	if (base_value_type == Utils::VARIABLE_TYPE_FLOAT)
	{
		gl.vertexAttribPointer(m_po_base_value_attribute_location, 1,							  /* size */
							   Utils::getGLDataTypeOfBaseVariableType(base_value_type), GL_FALSE, /* normalized */
							   0,																  /* stride */
							   DE_NULL);														  /* pointer */
		GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribPointer() call failed.");
	}
	else if (base_value_type == Utils::VARIABLE_TYPE_INT || base_value_type == Utils::VARIABLE_TYPE_UINT)
	{
		gl.vertexAttribIPointer(m_po_base_value_attribute_location, 1,						/* size */
								Utils::getGLDataTypeOfBaseVariableType(base_value_type), 0, /* stride */
								DE_NULL);													/* pointer */
		GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribIPointer() call failed.");
	}
	else
	{
		DE_ASSERT(base_value_type == Utils::VARIABLE_TYPE_DOUBLE);

		gl.vertexAttribLPointer(m_po_base_value_attribute_location, 1, /* size */
								GL_DOUBLE, 0,						   /* stride */
								DE_NULL);							   /* pointer */
		GLU_EXPECT_NO_ERROR(gl.getError(), "glVertxAttribLPointer() call failed.");
	}

	gl.enableVertexAttribArray(m_po_base_value_attribute_location);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnableVertexAttribArray() call failed.");

	/* Execute the draw call */
	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() call failed.");
	{
		gl.drawArrays(GL_POINTS, 0 /* first */, n_base_values);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed.");
	}
	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() call failed.");

	/* Map the XFB buffer object into process space */
	void* xfb_data_ptr = gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer() call failed.");
	DE_ASSERT(xfb_data_ptr != NULL);

	/* Verify the data */
	result &= verifyXFBData((const unsigned char*)xfb_data_ptr, test_case);

	/* Unmap the XFB BO */
	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed.");

	/** Good to release the data buffer at this point */
	if (m_base_value_bo_data != DE_NULL)
	{
		delete[] m_base_value_bo_data;

		m_base_value_bo_data = DE_NULL;
	}

	/* All done */
	return result;
}